

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)

{
  uint uVar1;
  byte value;
  uint uVar2;
  int iVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  undefined1 local_70 [40];
  Image local_48;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_70,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,value,0,0,(ImageTemplate<unsigned_char> *)local_70);
  local_70._0_8_ = &PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_70);
  uVar2 = rand();
  (*ProjectionProfile)
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,&local_48,
             (uVar2 & 1) == 0);
  uVar6 = local_70._8_8_ - local_70._0_8_;
  uVar1 = local_48._height;
  if ((uVar2 & 1) == 0) {
    uVar1 = local_48._width;
    local_48._width = local_48._height;
  }
  if ((long)uVar6 >> 2 != (ulong)uVar1) {
    bVar8 = false;
    goto LAB_00154f9b;
  }
  iVar3 = local_48._width * value;
  pp_Var4 = (_func_int **)local_70._0_8_;
  if (0 < (long)uVar6 >> 4) {
    lVar7 = ((long)uVar6 >> 4) + 1;
    pp_Var5 = (_func_int **)(local_70._0_8_ + 8);
    pp_Var4 = (_func_int **)((uVar6 & 0xfffffffffffffff0) + local_70._0_8_);
    do {
      if (*(int *)(pp_Var5 + -1) != iVar3) {
        pp_Var5 = pp_Var5 + -1;
        goto LAB_00154f95;
      }
      if (*(int *)((long)pp_Var5 + -4) != iVar3) {
        pp_Var5 = (_func_int **)((long)pp_Var5 + -4);
        goto LAB_00154f95;
      }
      if (*(int *)pp_Var5 != iVar3) goto LAB_00154f95;
      if (*(int *)((long)pp_Var5 + 4) != iVar3) {
        pp_Var5 = (_func_int **)((long)pp_Var5 + 4);
        goto LAB_00154f95;
      }
      lVar7 = lVar7 + -1;
      pp_Var5 = pp_Var5 + 2;
    } while (1 < lVar7);
    uVar6 = local_70._8_8_ - (long)pp_Var4;
  }
  lVar7 = (long)uVar6 >> 2;
  if (lVar7 == 1) {
LAB_00154f7a:
    pp_Var5 = pp_Var4;
    if (*(int *)pp_Var4 == iVar3) {
      pp_Var5 = (_func_int **)local_70._8_8_;
    }
  }
  else if (lVar7 == 2) {
LAB_00154f72:
    pp_Var5 = pp_Var4;
    if (*(int *)pp_Var4 == iVar3) {
      pp_Var4 = (_func_int **)((long)pp_Var4 + 4);
      goto LAB_00154f7a;
    }
  }
  else {
    pp_Var5 = (_func_int **)local_70._8_8_;
    if ((lVar7 == 3) && (pp_Var5 = pp_Var4, *(int *)pp_Var4 == iVar3)) {
      pp_Var4 = (_func_int **)((long)pp_Var4 + 4);
      goto LAB_00154f72;
    }
  }
LAB_00154f95:
  bVar8 = pp_Var5 == (_func_int **)local_70._8_8_;
LAB_00154f9b:
  if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_70._0_8_);
  }
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar8;
}

Assistant:

bool form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection = ProjectionProfile( image, horizontal );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }